

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

int32_t ucurr_getDefaultFractionDigitsForUsage_63
                  (UChar *currency,UCurrencyUsage usage,UErrorCode *ec)

{
  UBool UVar1;
  int32_t *piVar2;
  int32_t local_24;
  int32_t fracDigits;
  UErrorCode *ec_local;
  UCurrencyUsage usage_local;
  UChar *currency_local;
  
  local_24 = 0;
  UVar1 = U_SUCCESS(*ec);
  if (UVar1 != '\0') {
    if (usage == UCURR_USAGE_STANDARD) {
      piVar2 = _findMetaData(currency,ec);
      local_24 = *piVar2;
    }
    else if (usage == UCURR_USAGE_CASH) {
      piVar2 = _findMetaData(currency,ec);
      local_24 = piVar2[2];
    }
    else {
      *ec = U_UNSUPPORTED_ERROR;
    }
  }
  return local_24;
}

Assistant:

U_DRAFT int32_t U_EXPORT2
ucurr_getDefaultFractionDigitsForUsage(const UChar* currency, const UCurrencyUsage usage, UErrorCode* ec) {
    int32_t fracDigits = 0;
    if (U_SUCCESS(*ec)) {
        switch (usage) {
            case UCURR_USAGE_STANDARD:
                fracDigits = (_findMetaData(currency, *ec))[0];
                break;
            case UCURR_USAGE_CASH:
                fracDigits = (_findMetaData(currency, *ec))[2];
                break;
            default:
                *ec = U_UNSUPPORTED_ERROR;
        }
    }
    return fracDigits;
}